

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::AnyAverageDownAndSync
          (MLCellLinOp *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *sol)

{
  int ratio;
  int iVar1;
  undefined8 in_RSI;
  MLLinOp *in_RDI;
  MultiFab *unaff_retaddr;
  int falev;
  int ncomp;
  MultiFab *in_stack_ffffffffffffffc8;
  MLLinOp *in_stack_ffffffffffffffd0;
  MLLinOp *S_crse;
  
  S_crse = in_RDI;
  ratio = (*in_RDI->_vptr_MLLinOp[5])();
  iVar1 = MLLinOp::NAMRLevels(in_RDI);
  while (iVar1 = iVar1 + -1, 0 < iVar1) {
    Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
              ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffffd0,
               (size_type)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc8 = Any::get<amrex::MultiFab>((Any *)CONCAT44(ratio,iVar1));
    Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
              ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffffd0,
               (size_type)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = (MLLinOp *)Any::get<amrex::MultiFab>((Any *)CONCAT44(ratio,iVar1));
    MLLinOp::AMRRefRatio(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    EB_average_down(unaff_retaddr,(MultiFab *)S_crse,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,ratio)
    ;
  }
  return;
}

Assistant:

void
MLCellLinOp::AnyAverageDownAndSync (Vector<Any>& sol) const
{
    AMREX_ASSERT(sol[0].is<MultiFab>());

    int ncomp = getNComp();
    for (int falev = NAMRLevels()-1; falev > 0; --falev)
    {
#ifdef AMREX_USE_EB
        amrex::EB_average_down(sol[falev  ].get<MultiFab>(),
                               sol[falev-1].get<MultiFab>(), 0, ncomp, AMRRefRatio(falev-1));
#else
        amrex::average_down(sol[falev  ].get<MultiFab>(),
                            sol[falev-1].get<MultiFab>(), 0, ncomp, AMRRefRatio(falev-1));
#endif
    }
}